

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
::body(work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
       *this)

{
  __uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>,_true,_true>
  in_RAX;
  pthread_t pVar1;
  demand_unique_ptr_t d;
  _Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false> local_18;
  
  local_18._M_head_impl =
       (demand_t *)
       in_RAX.
       super___uniq_ptr_impl<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
       .
       super__Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false>
       ._M_head_impl;
  pVar1 = pthread_self();
  (this->
  super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  ).super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
  m_thread_id._M_thread = pVar1;
  do {
    pop_demand((work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>
                *)&stack0xffffffffffffffe8);
    call_handler(this,&(local_18._M_head_impl)->super_execution_demand_t);
    std::
    unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
    ::~unique_ptr((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
                   *)&stack0xffffffffffffffe8);
  } while( true );
}

Assistant:

void
		body()
			{
				this->m_thread_id = so_5::query_current_thread_id();

				try
					{
						for(;;)
							{
								auto d = this->pop_demand();
								this->call_handler( *d );
							}
					}
				catch( const typename DEMAND_QUEUE::shutdown_ex_t & )
					{}
			}